

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgUtils.hpp
# Opt level: O0

unique_ptr<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>_> __thiscall
TasGrid::Utils::make_unique<TasGrid::GridGlobal,TasGrid::AccelerationContext_const*&>
          (Utils *this,AccelerationContext **args)

{
  GridGlobal *this_00;
  AccelerationContext **args_local;
  
  this_00 = (GridGlobal *)operator_new(0x300);
  GridGlobal::GridGlobal(this_00,*args);
  ::std::unique_ptr<TasGrid::GridGlobal,std::default_delete<TasGrid::GridGlobal>>::
  unique_ptr<std::default_delete<TasGrid::GridGlobal>,void>
            ((unique_ptr<TasGrid::GridGlobal,std::default_delete<TasGrid::GridGlobal>> *)this,
             this_00);
  return (__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
         )(__uniq_ptr_data<TasGrid::GridGlobal,_std::default_delete<TasGrid::GridGlobal>,_true,_true>
           )this;
}

Assistant:

std::unique_ptr<T> make_unique(Args&&... args){
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}